

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O2

void __thiscall
websocketpp::connection<websocketpp::config::asio>::log_close_result
          (connection<websocketpp::config::asio> *this)

{
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  ostream *poVar1;
  size_t in_RCX;
  allocator local_1ea;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream s;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  poVar1 = std::operator<<(local_198,"Disconnect ");
  poVar1 = std::operator<<(poVar1,"close local:[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_local_close_code);
  if ((this->m_local_close_reason)._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_1e8,"",&local_1e9);
  }
  else {
    std::operator+(&local_1e8,",",&this->m_local_close_reason);
  }
  poVar1 = std::operator<<(poVar1,(string *)&local_1e8);
  poVar1 = std::operator<<(poVar1,"] remote:[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_remote_close_code);
  if ((this->m_remote_close_reason)._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_1c8,"",&local_1ea);
  }
  else {
    std::operator+(&local_1c8,",",&this->m_remote_close_reason);
  }
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  this_00 = (this->m_alog).
            super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  std::__cxx11::stringbuf::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (this_00,2,&local_1e8,in_RCX);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return;
}

Assistant:

void connection<config>::log_close_result()
{
    std::stringstream s;

    s << "Disconnect "
      << "close local:[" << m_local_close_code
      << (m_local_close_reason.empty() ? "" : ","+m_local_close_reason)
      << "] remote:[" << m_remote_close_code
      << (m_remote_close_reason.empty() ? "" : ","+m_remote_close_reason) << "]";

    m_alog->write(log::alevel::disconnect,s.str());
}